

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O3

unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_> __thiscall
Editor::makeCommand<commands::ToggleTiles,Board&,bool>(Editor *this,Board *args,bool *args_1)

{
  undefined1 *puVar1;
  long lVar2;
  Command *this_00;
  char *__s1;
  _func_int **pp_Var3;
  int iVar4;
  milliseconds mVar5;
  logger *this_01;
  long lVar6;
  bool *in_RCX;
  long lVar7;
  long lVar8;
  
  lVar6 = *(long *)&(args->chunkRenderCache_).field_0x8c8;
  lVar7 = *(long *)&(args->chunkRenderCache_).field_0x8b0;
  lVar2 = *(long *)&(args->chunkRenderCache_).field_0x8b8;
  lVar8 = (*(long *)&(args->chunkRenderCache_).field_0x8a0 -
           *(long *)&(args->chunkRenderCache_).field_0x890 >> 3) +
          (lVar7 - lVar2 >> 3) +
          ((((ulong)(lVar6 - *(long *)&(args->chunkRenderCache_).field_0x8a8) >> 3) - 1) +
          (ulong)(lVar6 == 0)) * 0x40;
  if ((lVar8 != 0) && (*(long *)&(args->chunkRenderCache_).field_0x8d8 == lVar8)) {
    if (lVar7 == lVar2) {
      lVar7 = *(long *)(lVar6 + -8) + 0x200;
    }
    this_00 = *(Command **)(lVar7 + -8);
    iVar4 = (*this_00->_vptr_Command[3])(this_00);
    if ((((char)iVar4 != '\0') &&
        (mVar5 = Command::getTimeSinceLastExecute(this_00), mVar5.__r < 1000)) &&
       ((__s1 = *(char **)(this_00->_vptr_Command[-1] + 8), __s1 == "N8commands11ToggleTilesE" ||
        ((*__s1 != '*' && (iVar4 = strcmp(__s1,"N8commands11ToggleTilesE"), iVar4 == 0)))))) {
      this_01 = spdlog::default_logger_raw();
      spdlog::logger::log(this_01,0.0);
      if (*(long *)&(args->chunkRenderCache_).field_0x8e0 ==
          *(long *)&(args->chunkRenderCache_).field_0x8d8) {
        *(undefined8 *)&(args->chunkRenderCache_).field_0x8e0 = 0xffffffffffffffff;
      }
      lVar6 = *(long *)&(args->chunkRenderCache_).field_0x8b0;
      if (lVar6 == *(long *)&(args->chunkRenderCache_).field_0x8b8) {
        lVar6 = *(long *)(*(long *)&(args->chunkRenderCache_).field_0x8c8 + -8) + 0x200;
      }
      pp_Var3 = *(_func_int ***)(lVar6 + -8);
      *(undefined8 *)(lVar6 + -8) = 0;
      std::
      deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
      ::pop_back((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                  *)&(args->chunkRenderCache_).field_0x880);
      puVar1 = &(args->chunkRenderCache_).field_0x8d8;
      *(long *)puVar1 = *(long *)puVar1 + -1;
      (this->super_Drawable)._vptr_Drawable = pp_Var3;
      return (__uniq_ptr_data<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>,_true,_true>
              )(__uniq_ptr_data<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>,_true,_true>
                )this;
    }
  }
  details::make_unique<commands::ToggleTiles,_Board_&,_bool,_0>
            ((details *)this,(Board *)args_1,in_RCX);
  return (__uniq_ptr_data<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>,_true,_true>
          )(__uniq_ptr_data<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> Editor::makeCommand(Args&&... args) {
    if (editHistory_.size() > 0 && lastEditSize_ == editHistory_.size()) {
        // If the command has the same type as the previous one and happened
        // recently, we can just add on to it instead of building a new command.

        Command& lastCommand = *editHistory_.back();
        if (lastCommand.isGroupingAllowed() && lastCommand.getTimeSinceLastExecute().count() < 1000 && typeid(lastCommand) == typeid(T)) {
            spdlog::debug("Last command has same type, returning it.");
            if (savedEditSize_ == lastEditSize_) {
                savedEditSize_ = std::numeric_limits<size_t>::max();
            }
            auto lastCommandPtr = static_cast<T*>(editHistory_.back().release());
            editHistory_.pop_back();
            --lastEditSize_;
            return std::unique_ptr<T>(lastCommandPtr);
        }

        // FIXME: eventually we may want to replace the above typeid checking with a function that gets a command-type from an enum.
        // could use a string instead, then we don't need an enum that is aware of all the commands.
        // the command-type id could be passed as first argument to command ctor?
    }
    return details::make_unique<T>(std::forward<Args>(args)...);
}